

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TablePrinter::TablePrinter
          (TablePrinter *this,ostream *os,
          vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
          *columnInfos)

{
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *columnInfos_local;
  ostream *os_local;
  TablePrinter *this_local;
  
  this->m_os = os;
  std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::vector(&this->m_columnInfos,columnInfos);
  ReusableStringStream::ReusableStringStream(&this->m_oss);
  this->m_currentColumn = -1;
  this->m_isOpen = false;
  return;
}

Assistant:

TablePrinter( std::ostream& os, std::vector<ColumnInfo> columnInfos )
    :   m_os( os ),
        m_columnInfos( CATCH_MOVE( columnInfos ) ) {}